

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rotation_matrices.cpp
# Opt level: O2

void rotationMatrices(void)

{
  double *pdVar1;
  ostream *poVar2;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *this;
  CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *pCVar3;
  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true>_> *this_00;
  Scalar *pSVar4;
  Scalar local_2a0;
  Scalar local_298;
  double local_290;
  double local_288;
  double local_280;
  double local_278;
  double local_270;
  double local_268;
  double local_260;
  double local_258;
  double local_250;
  double tzLeft;
  Scalar local_23c;
  Scalar local_238;
  Scalar local_234;
  Scalar local_230;
  float local_22c;
  float local_228;
  float local_224;
  float local_220;
  float local_21c;
  float local_218;
  float local_214;
  Vector3d translation;
  Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true> local_1f8;
  double tyLeft;
  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true>_> local_1b8;
  Affine3d transform_2;
  AngleAxisd yawAngle;
  AngleAxisd pitchAngle;
  AngleAxisd rollAngle;
  Affine3f t1;
  Matrix4f M;
  
  std::operator<<((ostream *)&std::cout,"Roll : ");
  poVar2 = std::ostream::_M_insert<double>(1.5707963267948966);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::operator<<((ostream *)&std::cout,"Pitch : ");
  poVar2 = std::ostream::_M_insert<double>(1.5707963267948966);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::operator<<((ostream *)&std::cout,"Yaw : ");
  poVar2 = std::ostream::_M_insert<double>(0.5235987755982988);
  std::endl<char,std::char_traits<char>>(poVar2);
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::UnitX();
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::Block<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const,3,1,false>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&rollAngle,
             (DenseBase<Eigen::Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_3,_1,_false>_>
              *)&transform_2);
  rollAngle.m_angle = 1.5707963267948966;
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::UnitY();
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::Block<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const,3,1,false>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&pitchAngle,
             (DenseBase<Eigen::Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_3,_1,_false>_>
              *)&transform_2);
  pitchAngle.m_angle = 1.5707963267948966;
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::UnitZ();
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::Block<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const,3,1,false>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&yawAngle,
             (DenseBase<Eigen::Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_3,_1,_false>_>
              *)&transform_2);
  yawAngle.m_angle = 0.5235987755982988;
  eulerAnglesToRotationMatrix
            ((Matrix3d *)&transform_2,1.5707963267948966,1.5707963267948966,0.5235987755982988);
  local_290 = transform_2.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
              m_storage.m_data.array[0];
  local_278 = transform_2.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
              m_storage.m_data.array[1];
  local_260 = transform_2.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
              m_storage.m_data.array[2];
  local_288 = transform_2.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
              m_storage.m_data.array[3];
  local_270 = transform_2.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
              m_storage.m_data.array[4];
  local_258 = transform_2.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
              m_storage.m_data.array[5];
  local_280 = transform_2.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
              m_storage.m_data.array[6];
  tyLeft = 0.0;
  local_268 = transform_2.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
              m_storage.m_data.array[7];
  local_250 = transform_2.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
              m_storage.m_data.array[8];
  tzLeft = -4.0;
  Eigen::internal::transform_make_affine<2>::run<Eigen::Matrix<float,4,4,0,4,4>>(&t1.m_matrix);
  transform_2.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data
  .array[0] = (double)&translation;
  transform_2.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data
  .array[1] = 0.0;
  transform_2.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data
  .array[2] = 4.94065645841247e-324;
  transform_2.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data
  .array[3] = 4.94065645841247e-324;
  translation.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = -1.0;
  this = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                   ((CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&transform_2,&tyLeft)
  ;
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_(this,&tzLeft);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::finished
            ((CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&transform_2);
  M.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
       (float)local_290;
  transform_2.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data
  .array[1] = 0.0;
  transform_2.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data
  .array[2] = 4.94065645841247e-324;
  transform_2.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data
  .array[3] = 4.94065645841247e-324;
  local_1f8.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true>,_0>.m_data =
       (PointerType)
       CONCAT44(local_1f8.
                super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true,_Eigen::Dense>.
                super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true,_true>.
                super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true>,_1>.
                super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true>,_0>.
                m_data._4_4_,(float)local_288);
  transform_2.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data
  .array[0] = (double)&M;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                     ((CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)&transform_2,
                      (Scalar *)&local_1f8);
  local_1b8.m_xpr =
       (Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true> *)
       CONCAT44(local_1b8.m_xpr._4_4_,(float)local_280);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar3,(Scalar *)&local_1b8);
  local_298 = (Scalar)CONCAT44(local_298._4_4_,
                               (float)translation.
                                      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                      m_storage.m_data.array[0]);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar3,(Scalar *)&local_298);
  local_2a0 = (Scalar)CONCAT44(local_2a0._4_4_,(float)local_278);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar3,(Scalar *)&local_2a0);
  local_214 = (float)local_270;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar3,&local_214);
  local_218 = (float)local_268;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar3,&local_218);
  local_21c = (float)translation.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array[1];
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar3,&local_21c);
  local_220 = (float)local_260;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar3,&local_220);
  local_224 = (float)local_258;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar3,&local_224);
  local_228 = (float)local_250;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar3,&local_228);
  local_22c = (float)translation.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array[2];
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar3,&local_22c);
  local_230 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar3,&local_230);
  local_234 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar3,&local_234);
  local_238 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar3,&local_238);
  local_23c = 1.0;
  Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_(pCVar3,&local_23c);
  Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::finished
            ((CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)&transform_2);
  Eigen::internal::call_assignment<Eigen::Matrix<float,4,4,0,4,4>,Eigen::Matrix<float,4,4,0,4,4>>
            (&t1.m_matrix,&M);
  Eigen::Transform<double,_3,_2,_0>::Identity();
  pdVar1 = transform_2.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
           m_storage.m_data.array + 0xc;
  local_1f8.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true,_true>.m_startRow.m_value =
       0;
  local_1f8.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true,_true>.m_startCol.m_value =
       3;
  local_1b8.m_row = 0;
  local_1f8.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true,_true>.m_outerStride = 4;
  local_1b8.m_col = 1;
  local_1b8.m_currentBlockRows = 1;
  transform_2.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data
  .array[0xc] = 2.5;
  local_298 = 1.0;
  local_1f8.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true>,_0>.m_data = pdVar1;
  local_1f8.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true,_true>.m_xpr =
       (XprTypeNested)&transform_2;
  local_1b8.m_xpr = &local_1f8;
  this_00 = Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true>_>
            ::operator_(&local_1b8,&local_298);
  local_2a0 = 0.5;
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true>_>::
  operator_(this_00,&local_2a0);
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true>_>::finished
            (&local_1b8);
  Eigen::AngleAxis<double>::operator*((QuaternionType *)&local_1b8,&yawAngle,&pitchAngle);
  Eigen::operator*((QuaternionType *)&local_1f8,(QuaternionType *)&local_1b8,&rollAngle);
  Eigen::Transform<double,3,2,0>::rotate<Eigen::Quaternion<double,0>>
            ((Transform<double,3,2,0> *)&transform_2,(Quaternion<double,_0> *)&local_1f8);
  poVar2 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)&transform_2);
  std::endl<char,std::char_traits<char>>(poVar2);
  local_1f8.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true,_true>.m_startRow.m_value =
       0;
  local_1f8.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true,_true>.m_startCol.m_value =
       3;
  local_1f8.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true,_true>.m_outerStride = 4;
  local_1f8.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true>,_0>.m_data = pdVar1;
  local_1f8.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true,_true>.m_xpr =
       (XprTypeNested)&transform_2;
  poVar2 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true>_>
                              *)&local_1f8);
  std::endl<char,std::char_traits<char>>(poVar2);
  local_1f8.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true,_true>.m_startRow.m_value =
       0;
  local_1f8.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true,_true>.m_startCol.m_value =
       3;
  local_1f8.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true,_true>.m_outerStride = 4;
  local_1f8.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true>,_0>.m_data = pdVar1;
  local_1f8.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true,_true>.m_xpr =
       (XprTypeNested)&transform_2;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true>,_1>
           ::x((DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true>,_1> *
               )&local_1f8);
  poVar2 = std::ostream::_M_insert<double>(*pSVar4);
  std::endl<char,std::char_traits<char>>(poVar2);
  local_1f8.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true,_true>.m_startRow.m_value =
       0;
  local_1f8.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true,_true>.m_startCol.m_value =
       3;
  local_1f8.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true,_true>.m_outerStride = 4;
  local_1f8.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true>,_0>.m_data = pdVar1;
  local_1f8.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true,_true>.m_xpr =
       (XprTypeNested)&transform_2;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true>,_1>
           ::y((DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true>,_1> *
               )&local_1f8);
  poVar2 = std::ostream::_M_insert<double>(*pSVar4);
  std::endl<char,std::char_traits<char>>(poVar2);
  local_1f8.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true,_true>.m_startRow.m_value =
       0;
  local_1f8.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true,_true>.m_startCol.m_value =
       3;
  local_1f8.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true,_true>.m_outerStride = 4;
  local_1f8.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true>,_0>.m_data = pdVar1;
  local_1f8.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true,_true>.m_xpr =
       (XprTypeNested)&transform_2;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true>,_1>
           ::z((DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true>,_1> *
               )&local_1f8);
  poVar2 = std::ostream::_M_insert<double>(*pSVar4);
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void rotationMatrices() {

  //////////////////// Rotation Matrix (Tait–Bryan) ////////////////////////
  double roll, pitch, yaw;
  roll = M_PI / 2;
  pitch = M_PI / 2;
  yaw = M_PI / 6;
  std::cout << "Roll : " << roll << std::endl;
  std::cout << "Pitch : " << pitch << std::endl;
  std::cout << "Yaw : " << yaw << std::endl;

  // Roll, Pitch, Yaw to Rotation Matrix
  // Eigen::AngleAxis<double> rollAngle(roll, Eigen::Vector3d(1,0,0));
  Eigen::AngleAxisd rollAngle(roll, Eigen::Vector3d::UnitX());
  Eigen::AngleAxisd pitchAngle(pitch, Eigen::Vector3d::UnitY());
  Eigen::AngleAxisd yawAngle(yaw, Eigen::Vector3d::UnitZ());

////////////////////////////////////////Comparing with
/// KDL////////////////////////////////////////
#if KDL_FOUND == 1
  KDL::Frame F;
  F.M = F.M.RPY(roll, pitch, yaw);
  std::cout << F.M(0, 0) << " " << F.M(0, 1) << " " << F.M(0, 2) << std::endl;
  std::cout << F.M(1, 0) << " " << F.M(1, 1) << " " << F.M(1, 2) << std::endl;
  std::cout << F.M(2, 0) << " " << F.M(2, 1) << " " << F.M(2, 2) << std::endl;

  double x, y, z, w;
  F.M.GetQuaternion(x, y, z, w);
  std::cout << "KDL Frame Quaternion:" << std::endl;
  std::cout << "x: " << x << std::endl;
  std::cout << "y: " << y << std::endl;
  std::cout << "z: " << z << std::endl;
  std::cout << "w: " << w << std::endl;
#endif

  Eigen::Matrix3d rotation;
  rotation = eulerAnglesToRotationMatrix(roll, pitch, yaw);

  double txLeft, tyLeft, tzLeft;
  txLeft = -1;
  tyLeft = 0.0;
  tzLeft = -4.0;

  Eigen::Affine3f t1;
  Eigen::Matrix4f M;
  Eigen::Vector3d translation;
  translation << txLeft, tyLeft, tzLeft;

  M << rotation(0, 0), rotation(0, 1), rotation(0, 2), translation(0, 0),
      rotation(1, 0), rotation(1, 1), rotation(1, 2), translation(1, 0),
      rotation(2, 0), rotation(2, 1), rotation(2, 2), translation(2, 0), 0, 0,
      0, 1;

  t1 = M;

  Eigen::Affine3d transform_2 = Eigen::Affine3d::Identity();

  // Define a translation of 2.5 meters on the x axis.
  transform_2.translation() << 2.5, 1.0, 0.5;

  // The same rotation matrix as before; tetha radians arround Z axis
  transform_2.rotate(yawAngle * pitchAngle * rollAngle);
  std::cout << transform_2.matrix() << std::endl;
  std::cout << transform_2.translation() << std::endl;
  std::cout << transform_2.translation().x() << std::endl;
  std::cout << transform_2.translation().y() << std::endl;
  std::cout << transform_2.translation().z() << std::endl;
}